

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall
toml::
result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cleanup(result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((this->is_ok_ & 1U) == 0) {
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure((failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&(this->field_1).succ);
  }
  else {
    success<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
    ::~success(&(this->field_1).succ);
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        if(this->is_ok_) {this->succ.~success_type();}
        else             {this->fail.~failure_type();}
        return;
    }